

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual.cpp
# Opt level: O2

BOOL VIRTUALIsPageCommitted(SIZE_T nBitToRetrieve,PCMI pInformation)

{
  if (pInformation != (PCMI)0x0) {
    return (BOOL)((pInformation->pAllocState[nBitToRetrieve >> 3] >> ((uint)nBitToRetrieve & 7) & 1)
                 != 0);
  }
  if (PAL_InitializeChakraCoreCalled) {
    return 0;
  }
  abort();
}

Assistant:

static BOOL VIRTUALIsPageCommitted( SIZE_T nBitToRetrieve, CONST PCMI pInformation )
{
    SIZE_T nByteOffset = 0;
    UINT nBitOffset = 0;
    UINT byteMask = 0;

    if ( !pInformation )
    {
        ERROR( "pInformation was NULL!\n" );
        return FALSE;
    }

    nByteOffset = nBitToRetrieve / CHAR_BIT;
    nBitOffset = nBitToRetrieve % CHAR_BIT;

    byteMask = 1 << nBitOffset;

    if ( pInformation->pAllocState[ nByteOffset ] & byteMask )
    {
        return TRUE;
    }
    else
    {
        return FALSE;
    }
}